

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_3> local_4c;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_58,(Vector<float,_2> *)s_constInVec2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_60.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_60,(Vector<float,_2> *)(s_constInVec2 + 8));
  }
  outerProduct<float,2,2>((MatrixCaseUtils *)&local_40,&local_58,&local_60);
  local_4c.m_data[2] = local_3c + local_34;
  local_4c.m_data[0] = local_40;
  local_4c.m_data[1] = local_38;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_4c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}